

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O0

string * __thiscall Terms::toString_abi_cxx11_(string *__return_storage_ptr__,Terms *this)

{
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  __normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_> local_60;
  string local_58;
  Node *local_38;
  Node *local_30;
  Node *local_28;
  undefined1 local_19;
  Terms *local_18;
  Terms *this_local;
  string *terms;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Terms *)__return_storage_ptr__;
  local_30 = (Node *)std::begin<std::vector<Node,std::allocator<Node>>>(&this->_terms);
  local_28 = (Node *)std::
                     next<__gnu_cxx::__normal_iterator<Node*,std::vector<Node,std::allocator<Node>>>>
                               ((__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>
                                 )local_30,1);
  local_38 = (Node *)std::end<std::vector<Node,std::allocator<Node>>>(&this->_terms);
  local_60._M_current = (Node *)std::vector<Node,_std::allocator<Node>_>::begin(&this->_terms);
  this_00 = __gnu_cxx::__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>::
            operator->(&local_60);
  Node::nodeWithNegate_abi_cxx11_(&local_58,this_00);
  std::
  accumulate<__gnu_cxx::__normal_iterator<Node*,std::vector<Node,std::allocator<Node>>>,std::__cxx11::string,Terms::toString()::_lambda(std::__cxx11::string_const&,Node_const&)_1_>
            (__return_storage_ptr__,local_28,local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if ((this->_negate & 1U) != 0) {
    std::operator+(&local_b8,"(",__return_storage_ptr__);
    std::operator+(&local_98,&local_b8,")\'");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

string toString() {
    string terms = accumulate(next(begin(this->_terms)), end(this->_terms), this->_terms.begin()->nodeWithNegate(),
      [] (const string& s, const Node& i) {
        return s + " " + i.nodeWithNegate();
      });
    
    if (this->_negate) {
      terms = "(" + terms + ")'";
    }

    return terms;
  }